

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_find_Test<std::pair<char16_t,_char32_t>_>::TestBody
          (UnicodeFullTest_find_Test<std::pair<char16_t,_char32_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  char32_t (*in_RDX) [5];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_string;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  char *pcVar3;
  AssertionResult AVar4;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_00;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_01;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_02;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_03;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_04;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_05;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_06;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_07;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_08;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_09;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_10;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_11;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_12;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_13;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_14;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_15;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_16;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_17;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_18;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_19;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_20;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_02;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_03;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_04;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_05;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_06;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_07;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_08;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_09;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_10;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_11;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_12;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_13;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_14;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_15;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_16;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_17;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_18;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_19;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_20;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_21;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_22;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> double_abcd_str;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> abcd_str;
  undefined8 local_b0;
  size_t local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  char32_t *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long local_88;
  undefined4 local_80;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_78;
  int local_54;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  jessilib::string_cast<char16_t,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity =
       (ulong)(uint)local_78.field_2._M_allocated_capacity._4_4_ << 0x20;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = paVar1;
  in_string_00._M_str = local_50._M_dataplus._M_p;
  in_string_00._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>
                       (in_string_00,
                        (basic_string_view<char32_t,_std::char_traits<char32_t>_>)(auVar2 << 0x40));
  local_b0 = (ulong)local_b0._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x126,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x41;
  local_78._M_string_length = 1;
  in_substring._M_str = (char32_t *)paVar1;
  in_substring._M_len = 1;
  in_string_01._M_str = local_50._M_dataplus._M_p;
  in_string_01._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_01,in_substring);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x129,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x42;
  local_78._M_string_length = 1;
  in_substring_00._M_str = (char32_t *)paVar1;
  in_substring_00._M_len = 1;
  in_string_02._M_str = local_50._M_dataplus._M_p;
  in_string_02._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_02,in_substring_00);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x12a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x43;
  local_78._M_string_length = 1;
  in_substring_01._M_str = (char32_t *)paVar1;
  in_substring_01._M_len = 1;
  in_string_03._M_str = local_50._M_dataplus._M_p;
  in_string_03._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_03,in_substring_01);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,299,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x44;
  local_78._M_string_length = 1;
  in_substring_02._M_str = (char32_t *)paVar1;
  in_substring_02._M_len = 1;
  in_string_04._M_str = local_50._M_dataplus._M_p;
  in_string_04._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_04,in_substring_02);
  local_b0 = CONCAT44(local_b0._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))","3",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,300,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x45;
  local_78._M_string_length = 1;
  in_substring_03._M_str = (char32_t *)paVar1;
  in_substring_03._M_len = 1;
  in_string_05._M_str = local_50._M_dataplus._M_p;
  in_string_05._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_05,in_substring_03);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))",
             "decltype(abcd_str)::npos",&local_a8,&std::__cxx11::u16string::npos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x12d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4200000041;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_04._M_str = (char32_t *)paVar1;
  in_substring_04._M_len = 2;
  in_string_06._M_str = local_50._M_dataplus._M_p;
  in_string_06._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_06,in_substring_04);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x130,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4300000042;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_05._M_str = (char32_t *)paVar1;
  in_substring_05._M_len = 2;
  in_string_07._M_str = local_50._M_dataplus._M_p;
  in_string_07._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_07,in_substring_05);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x131,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4400000043;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_06._M_str = (char32_t *)paVar1;
  in_substring_06._M_len = 2;
  in_string_08._M_str = local_50._M_dataplus._M_p;
  in_string_08._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_08,in_substring_06);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x132,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4100000044;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_07._M_str = (char32_t *)paVar1;
  in_substring_07._M_len = 2;
  in_string_09._M_str = local_50._M_dataplus._M_p;
  in_string_09._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char16_t,char32_t,true>(in_string_09,in_substring_07);
  AVar4 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&local_98,
                     "find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))"
                     ,"decltype(abcd_str)::npos",&local_a8,&std::__cxx11::u16string::npos);
  in_string._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar4.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
    in_string = extraout_RDX.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x133,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    in_string._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      in_string._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
    in_string = extraout_RDX_02.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  }
  jessilib::string_cast<char16_t,char32_t[9]>
            (&local_78,(jessilib *)L"AABBCCDD",(char32_t (*) [9])in_string._M_head_impl);
  local_88 = 0x41;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_08._M_str = (char32_t *)&local_88;
  in_substring_08._M_len = 1;
  in_string_10._M_str = local_78._M_dataplus._M_p;
  in_string_10._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_10,in_substring_08);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x138,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x42;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_09._M_str = (char32_t *)&local_88;
  in_substring_09._M_len = 1;
  in_string_11._M_str = local_78._M_dataplus._M_p;
  in_string_11._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_11,in_substring_09);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x139,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x43;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_10._M_str = (char32_t *)&local_88;
  in_substring_10._M_len = 1;
  in_string_12._M_str = local_78._M_dataplus._M_p;
  in_string_12._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_12,in_substring_10);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x44;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_11._M_str = (char32_t *)&local_88;
  in_substring_11._M_len = 1;
  in_string_13._M_str = local_78._M_dataplus._M_p;
  in_string_13._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_13,in_substring_11);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x45;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_12._M_str = (char32_t *)&local_88;
  in_substring_12._M_len = 1;
  in_string_14._M_str = local_78._M_dataplus._M_p;
  in_string_14._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_14,in_substring_12);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::u16string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4100000041;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_13._M_str = (char32_t *)&local_88;
  in_substring_13._M_len = 2;
  in_string_15._M_str = local_78._M_dataplus._M_p;
  in_string_15._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_15,in_substring_13);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AA\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x13f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4200000041;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_14._M_str = (char32_t *)&local_88;
  in_substring_14._M_len = 2;
  in_string_16._M_str = local_78._M_dataplus._M_p;
  in_string_16._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_16,in_substring_14);
  local_54 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))"
             ,"1",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x140,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4200000042;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_15._M_str = (char32_t *)&local_88;
  in_substring_15._M_len = 2;
  in_string_17._M_str = local_78._M_dataplus._M_p;
  in_string_17._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_17,in_substring_15);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BB\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x141,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4300000042;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_16._M_str = (char32_t *)&local_88;
  in_substring_16._M_len = 2;
  in_string_18._M_str = local_78._M_dataplus._M_p;
  in_string_18._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_18,in_substring_16);
  local_54 = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))"
             ,"3",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x142,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4300000043;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_17._M_str = (char32_t *)&local_88;
  in_substring_17._M_len = 2;
  in_string_19._M_str = local_78._M_dataplus._M_p;
  in_string_19._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_19,in_substring_17);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CC\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x143,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4400000043;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_18._M_str = (char32_t *)&local_88;
  in_substring_18._M_len = 2;
  in_string_20._M_str = local_78._M_dataplus._M_p;
  in_string_20._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_20,in_substring_18);
  local_54 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))"
             ,"5",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x144,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4400000044;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_19._M_str = (char32_t *)&local_88;
  in_substring_19._M_len = 2;
  in_string_21._M_str = local_78._M_dataplus._M_p;
  in_string_21._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_21,in_substring_19);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DD\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x145,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4100000044;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_20._M_str = (char32_t *)&local_88;
  in_substring_20._M_len = 2;
  in_string_22._M_str = local_78._M_dataplus._M_p;
  in_string_22._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char16_t,char32_t,true>(in_string_22,in_substring_20);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::u16string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x146,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, find) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");

	// Empty substring
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"")), 0);

	// Single-characters
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 1);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 2);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 3);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(abcd_str)::npos);

	// Two characters
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 0);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 1);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 2);
	EXPECT_EQ(find(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(abcd_str)::npos);

	auto double_abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"AABBCCDD");

	// Single-characters
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 2);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 4);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 6);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(double_abcd_str)::npos);

	// Two characters
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AA")), 0);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 1);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BB")), 2);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 3);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CC")), 4);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 5);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DD")), 6);
	EXPECT_EQ(find(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(double_abcd_str)::npos);
}